

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeLangevin.cpp
# Opt level: O1

void __thiscall
OpenMD::FluctuatingChargeLangevin::FluctuatingChargeLangevin
          (FluctuatingChargeLangevin *this,SimInfo *info)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  FluctuatingChargePropagator::FluctuatingChargePropagator
            (&this->super_FluctuatingChargePropagator,info);
  (this->super_FluctuatingChargePropagator)._vptr_FluctuatingChargePropagator =
       (_func_int **)&PTR__FluctuatingChargeLangevin_00302180;
  *(undefined4 *)&(this->super_FluctuatingChargePropagator).field_0x2c = 4;
  this->forceTolerance_ = 1e-06;
  this->snap_ = info->sman_->currentSnapshot_;
  (this->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (info->randNumGen_).
           super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (info->randNumGen_).
           super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  *(undefined4 *)&(this->forceDistribution_)._M_param._M_mean = 0;
  *(undefined4 *)((long)&(this->forceDistribution_)._M_param._M_mean + 4) = 0;
  *(undefined4 *)&(this->forceDistribution_)._M_param._M_stddev = 0;
  *(undefined4 *)((long)&(this->forceDistribution_)._M_param._M_stddev + 4) = 0x3ff00000;
  (this->forceDistribution_)._M_saved = 0.0;
  (this->forceDistribution_)._M_saved_available = false;
  return;
}

Assistant:

FluctuatingChargeLangevin::FluctuatingChargeLangevin(SimInfo* info) :
      FluctuatingChargePropagator(info), maxIterNum_(4), forceTolerance_(1e-6),
      snap_(info->getSnapshotManager()->getCurrentSnapshot()),
      randNumGen_(info->getRandomNumberGenerator()) {}